

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.c
# Opt level: O0

void converter_perror(char *spec)

{
  char *spec_local;
  
  perr(spec);
  perr("\n");
  if (errnum != CONVERTER_ERROR_VOID) {
    if (errnum == CONVERTER_ERROR_NODICT) {
      perr("No dictionary loaded");
    }
    else if (errnum == CONVERTER_ERROR_OUTBUF) {
      perr("Output buffer not enough for one segment");
    }
    else {
      perr("Unknown");
    }
  }
  return;
}

Assistant:

void converter_perror(const char * spec)
{
	perr(spec);
	perr("\n");
	switch(errnum)
	{
	case CONVERTER_ERROR_VOID:
		break;
	case CONVERTER_ERROR_NODICT:
		perr(_("No dictionary loaded"));
		break;
	case CONVERTER_ERROR_OUTBUF:
		perr(_("Output buffer not enough for one segment"));
		break;
	default:
		perr(_("Unknown"));
	}
}